

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall
StackArgWithFormalsTracker::SetFormalsArraySyms(StackArgWithFormalsTracker *this,SymID symId)

{
  JitArenaAllocator *pJVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_40;
  SymID local_14;
  StackArgWithFormalsTracker *pSStack_10;
  SymID symId_local;
  StackArgWithFormalsTracker *this_local;
  
  local_14 = symId;
  pSStack_10 = this;
  if (this->formalsArraySyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pJVar1 = this->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x74e);
    pJVar1 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar1,&local_40);
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,pJVar1,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->alloc);
    this->formalsArraySyms = this_00;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this->formalsArraySyms,local_14);
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetFormalsArraySyms(SymID symId)
{
    if (formalsArraySyms == nullptr)
    {
        formalsArraySyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    }
    formalsArraySyms->Set(symId);
}